

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O3

ActionResults * __thiscall WhiteRoomOneAction::Drop(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  itemType local_3c;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == DISCUS) {
    local_3c = DISCUS;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_3c);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == BACKPACK) {
      local_3c = DISCUS;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_3c);
      ItemWrapper::setLocation(pIVar3,W_ROOM1);
      pAVar4 = (ActionResults *)operator_new(0x30);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "The discus rolls around on the floor. You\'re backpack is .000024 kilograms lighter."
                 ,"");
      ActionResults::ActionResults(pAVar4,CURRENT,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return pAVar4;
      }
      operator_delete(local_38._M_dataplus._M_p);
      return pAVar4;
    }
  }
  pAVar4 = AbstractRoomAction::Drop(&this->super_AbstractRoomAction);
  return pAVar4;
}

Assistant:

ActionResults *WhiteRoomOneAction::Drop() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK) {
        itemList->getValue(DISCUS)->setLocation(W_ROOM1);
        return new ActionResults(CURRENT, "The discus rolls around on the floor. You're backpack is .000024 kilograms lighter.");
    }
    else {
        return AbstractRoomAction::Drop();
    }
}